

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::tryRead
          (HttpInputStreamImpl *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  Promise<unsigned_long> *pPVar1;
  PromiseAwaiter<unsigned_long> *pPVar2;
  ulong uVar3;
  void *__src;
  PromiseArenaMember *pPVar4;
  SourceLocation location;
  coroutine_handle<void> coroutine;
  unsigned_long uVar5;
  ulong in_R8;
  bool bVar6;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Fault local_68;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_60;
  ulong local_38;
  
  local_38 = in_R8;
  coroutine._M_fr_ptr = operator_new(0x600);
  *(code **)coroutine._M_fr_ptr = tryRead;
  *(code **)((long)coroutine._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  local_60.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x587dd6;
  local_60.right = (None *)0x5895d3;
  local_60.op.content.ptr = (char *)0x1300000654;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x654;
  location.columnNumber = 0x13;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  local_60.left =
       (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)((long)buffer + 0xd8);
  bVar6 = *(long *)((long)buffer + 0xe0) == 0;
  local_60.right = (None *)&kj::none;
  local_60.op.content.ptr = " != ";
  local_60.op.content.size_ = 5;
  local_60.result = !bVar6;
  if (bVar6) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x657,FAILED,"onMessageDone != kj::none","_kjCondition,",&local_60);
    kj::_::Debug::Fault::fatal(&local_68);
  }
  uVar3 = *(ulong *)((long)buffer + 0x40);
  if (uVar3 == 0) {
    pPVar1 = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5e0);
    (**(code **)(**(long **)((long)buffer + 0x10) + 8))
              (pPVar1,*(long **)((long)buffer + 0x10),minBytes,maxBytes,local_38);
    pPVar2 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x240);
    co_await<unsigned_long>(pPVar2,pPVar1);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
    bVar6 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (bVar6) {
      return (PromiseBase)(PromiseBase)this;
    }
    uVar5 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar2);
    *(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5d8) = uVar5;
    kj::_::Coroutine<unsigned_long>::fulfill
              (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5d8));
    if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x260));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
    pPVar4 = &((pPVar1->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar4 != (PromiseArenaMember *)0x0) {
      (pPVar1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
  }
  else {
    __src = *(void **)((long)buffer + 0x38);
    if (uVar3 < local_38) {
      memcpy((void *)minBytes,__src,uVar3);
      uVar3 = *(ulong *)((long)buffer + 0x40);
      *(ulong *)((long)coroutine._M_fr_ptr + 0x5f0) = uVar3;
      *(undefined8 *)((long)buffer + 0x38) = 0;
      *(undefined8 *)((long)buffer + 0x40) = 0;
      if (maxBytes < uVar3 || maxBytes - uVar3 == 0) {
        *(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c8) = uVar3;
        kj::_::Coroutine<unsigned_long>::fulfill
                  (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c8));
      }
      else {
        pPVar1 = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5e8);
        (**(code **)(**(long **)((long)buffer + 0x10) + 8))
                  (pPVar1,*(long **)((long)buffer + 0x10),minBytes + uVar3,maxBytes - uVar3,
                   local_38 - uVar3);
        pPVar2 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x400);
        co_await<unsigned_long>(pPVar2,pPVar1);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f8) = 1;
        bVar6 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
        if (bVar6) {
          return (PromiseBase)(PromiseBase)this;
        }
        uVar5 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar2);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x418) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x420));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
        pPVar4 = &((pPVar1->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar4 != (PromiseArenaMember *)0x0) {
          (pPVar1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar4);
        }
        *(unsigned_long *)((long)coroutine._M_fr_ptr + 0x5c0) =
             uVar5 + *(long *)((long)coroutine._M_fr_ptr + 0x5f0);
        kj::_::Coroutine<unsigned_long>::fulfill
                  (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5c0));
      }
    }
    else {
      memcpy((void *)minBytes,__src,local_38);
      *(long *)((long)buffer + 0x38) = *(long *)((long)buffer + 0x38) + local_38;
      *(long *)((long)buffer + 0x40) = *(long *)((long)buffer + 0x40) - local_38;
      *(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5d0) = local_38;
      kj::_::Coroutine<unsigned_long>::fulfill
                (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x5d0));
    }
  }
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f8) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
    // Read message body data.

    KJ_REQUIRE(onMessageDone != kj::none);

    if (leftover == nullptr) {
      // No leftovers. Forward directly to inner stream.
      co_return co_await inner.tryRead(buffer, minBytes, maxBytes);
    } else if (leftover.size() >= maxBytes) {
      // Didn't even read the entire leftover buffer.
      memcpy(buffer, leftover.begin(), maxBytes);
      leftover = leftover.slice(maxBytes, leftover.size());
      co_return maxBytes;
    } else {
      // Read the entire leftover buffer, plus some.
      memcpy(buffer, leftover.begin(), leftover.size());
      size_t copied = leftover.size();
      leftover = nullptr;
      if (copied >= minBytes) {
        // Got enough to stop here.
        co_return copied;
      } else {
        // Read the rest from the underlying stream.
        auto n = co_await inner.tryRead(reinterpret_cast<byte*>(buffer) + copied,
                             minBytes - copied, maxBytes - copied);
        co_return n + copied;
      }
    }
  }